

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.hpp
# Opt level: O0

index_t * __thiscall type_safe::index_t::operator-=(index_t *this,difference_t *rhs)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  ulong *puVar4;
  integer<unsigned_long,_type_safe::undefined_behavior_arithmetic> *piVar5;
  index_t *local_188;
  index_t *local_178;
  ulong local_160;
  ulong local_148;
  index_t *local_140;
  index_t *local_138;
  difference_t *local_130;
  difference_t *rhs_local;
  index_t *this_local;
  index_t *local_118;
  index_t **local_110;
  undefined1 local_108 [8];
  ulong local_100;
  ulong local_f8;
  integer<unsigned_long,_type_safe::undefined_behavior_arithmetic> *local_f0;
  undefined1 local_e8 [8];
  integer<unsigned_long,_type_safe::undefined_behavior_arithmetic> *local_e0;
  char *local_d8;
  undefined4 local_d0;
  regular_void local_c1;
  index_t **local_c0;
  index_t **local_b8;
  index_t **local_b0;
  undefined1 *local_a8;
  ulong *local_a0;
  undefined1 *local_98;
  char *local_90;
  undefined4 local_88;
  regular_void local_79;
  ulong *local_78;
  index_t *local_70;
  integer<long,_type_safe::undefined_behavior_arithmetic> *local_68;
  ulong *local_60;
  undefined1 local_58 [8];
  integer<long,_type_safe::undefined_behavior_arithmetic> *local_50;
  ulong *local_48;
  index_t **local_40;
  undefined1 *local_38;
  char *local_30;
  undefined4 local_28;
  regular_void local_19;
  long local_18;
  ulong local_10;
  
  local_130 = rhs;
  rhs_local = (difference_t *)this;
  local_f0 = get<type_safe::index_t,type_safe::integer<unsigned_long,type_safe::undefined_behavior_arithmetic>>
                       (&this->
                         super_strong_typedef<type_safe::index_t,_type_safe::integer<unsigned_long,_type_safe::undefined_behavior_arithmetic>_>
                       );
  uVar1 = local_f0->value_;
  local_78 = &local_100;
  local_100 = uVar1;
  local_e0 = local_f0;
  uVar3 = std::numeric_limits<long>::max();
  if (uVar3 < uVar1) {
    local_90 = 
    "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/integer.hpp"
    ;
    local_88 = 0x167;
    debug_assert::detail::
    do_assert<bool()noexcept,type_safe::detail::precondition_error_handler,char_const(&)[26]>
              (debug_assert::detail::always_false,&local_90,"","conversion would overflow");
    puVar4 = (ulong *)debug_assert::detail::regular_void::operator_cast_to_long_(&local_79);
    local_160 = *puVar4;
  }
  else {
    local_160 = *local_78;
  }
  local_f8 = local_160;
  local_98 = local_e8;
  local_a0 = &local_f8;
  local_148 = local_160;
  local_68 = get<type_safe::difference_t,type_safe::integer<long,type_safe::undefined_behavior_arithmetic>>
                       (&local_130->
                         super_strong_typedef<type_safe::difference_t,_type_safe::integer<long,_type_safe::undefined_behavior_arithmetic>_>
                       );
  local_60 = &local_148;
  local_10 = local_148;
  local_18 = local_68->value_;
  local_50 = local_68;
  local_48 = local_60;
  bVar2 = detail::will_subtraction_error<long>(local_148,local_18);
  if (bVar2) {
    local_30 = 
    "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/arithmetic_policy.hpp"
    ;
    local_28 = 0x9a;
    debug_assert::detail::
    do_assert<bool()noexcept,type_safe::detail::precondition_error_handler,char_const(&)[37]>
              (debug_assert::detail::always_false,&local_30,"",
               "subtraction will result in underflow");
    puVar4 = (ulong *)debug_assert::detail::regular_void::operator_cast_to_long_(&local_19);
    local_178 = (index_t *)*puVar4;
  }
  else {
    local_178 = (index_t *)(local_10 - local_18);
  }
  local_70 = local_178;
  local_38 = local_58;
  local_40 = &local_70;
  local_140 = local_178;
  local_110 = &local_140;
  this_local = local_178;
  local_c0 = &this_local;
  local_b8 = local_110;
  if ((long)local_178 < 0) {
    local_d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/integer.hpp"
    ;
    local_d0 = 0x186;
    debug_assert::detail::
    do_assert<bool()noexcept,type_safe::detail::precondition_error_handler,char_const(&)[27]>
              (debug_assert::detail::always_false,&local_d8,"","conversion would underflow");
    puVar4 = debug_assert::detail::regular_void::operator_cast_to_unsigned_long_(&local_c1);
    local_188 = (index_t *)*puVar4;
  }
  else {
    local_188 = local_178;
  }
  local_118 = local_188;
  local_a8 = local_108;
  local_b0 = &local_118;
  local_138 = local_188;
  piVar5 = get<type_safe::index_t,type_safe::integer<unsigned_long,type_safe::undefined_behavior_arithmetic>>
                     (&this->
                       super_strong_typedef<type_safe::index_t,_type_safe::integer<unsigned_long,_type_safe::undefined_behavior_arithmetic>_>
                     );
  piVar5->value_ = (integer_type_conflict1)local_138;
  return this;
}

Assistant:

index_t& operator-=(const difference_t& rhs) noexcept
    {
        get(*this) = make_unsigned(make_signed(get(*this)) - get(rhs));
        return *this;
    }